

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

JavascriptString *
Js::LiteralStringWithPropertyStringPtr::CreateEmptyString(JavascriptLibrary *library)

{
  Recycler *alloc;
  LiteralStringWithPropertyStringPtr *this;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5ff2f34;
  data.filename._0_4_ = 0x44;
  alloc = Memory::Recycler::TrackAllocInfo(library->recycler,(TrackAllocData *)local_40);
  this = (LiteralStringWithPropertyStringPtr *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
  LiteralStringWithPropertyStringPtr(this,L"",0,library);
  return (JavascriptString *)this;
}

Assistant:

JavascriptString * LiteralStringWithPropertyStringPtr::CreateEmptyString(JavascriptLibrary *const library)
    {
        return (JavascriptString*) RecyclerNew(library->GetRecycler(), LiteralStringWithPropertyStringPtr, _u(""), 0, library);
    }